

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_result ma_spatializer_listener_init_preallocated
                    (ma_spatializer_listener_config *pConfig,void *pHeap,
                    ma_spatializer_listener *pListener)

{
  ma_channel *pmVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  ma_handedness mVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  ma_uint32 mVar9;
  undefined4 uVar10;
  ma_vec3f mVar11;
  undefined1 local_60 [8];
  ma_spatializer_listener_heap_layout heapLayout;
  ma_result result;
  ma_spatializer_listener *pListener_local;
  void *pHeap_local;
  ma_spatializer_listener_config *pConfig_local;
  
  if (pListener == (ma_spatializer_listener *)0x0) {
    pConfig_local._4_4_ = MA_INVALID_ARGS;
  }
  else {
    memset(pListener,0,0x68);
    heapLayout.channelMapOutOffset._4_4_ =
         ma_spatializer_listener_get_heap_layout
                   (pConfig,(ma_spatializer_listener_heap_layout *)local_60);
    pConfig_local._4_4_ = heapLayout.channelMapOutOffset._4_4_;
    if (heapLayout.channelMapOutOffset._4_4_ == MA_SUCCESS) {
      pListener->_pHeap = pHeap;
      if (local_60 != (undefined1  [8])0x0) {
        memset(pHeap,0,(size_t)local_60);
      }
      mVar9 = pConfig->channelsOut;
      uVar10 = *(undefined4 *)&pConfig->field_0x4;
      pmVar1 = pConfig->pChannelMapOut;
      mVar5 = pConfig->handedness;
      fVar6 = pConfig->coneInnerAngleInRadians;
      fVar7 = pConfig->coneOuterAngleInRadians;
      fVar8 = pConfig->coneOuterGain;
      fVar2 = (pConfig->worldUp).x;
      fVar3 = (pConfig->worldUp).y;
      fVar4 = (pConfig->worldUp).z;
      (pListener->config).speedOfSound = pConfig->speedOfSound;
      (pListener->config).worldUp.x = fVar2;
      (pListener->config).worldUp.y = fVar3;
      (pListener->config).worldUp.z = fVar4;
      (pListener->config).handedness = mVar5;
      (pListener->config).coneInnerAngleInRadians = fVar6;
      (pListener->config).coneOuterAngleInRadians = fVar7;
      (pListener->config).coneOuterGain = fVar8;
      (pListener->config).channelsOut = mVar9;
      *(undefined4 *)&(pListener->config).field_0x4 = uVar10;
      (pListener->config).pChannelMapOut = pmVar1;
      mVar11 = ma_vec3f_init_3f(0.0,0.0,0.0);
      (pListener->position).z = mVar11.z;
      (pListener->position).x = (float)(int)mVar11._0_8_;
      (pListener->position).y = (float)(int)((ulong)mVar11._0_8_ >> 0x20);
      mVar11 = ma_vec3f_init_3f(0.0,0.0,-1.0);
      (pListener->direction).z = mVar11.z;
      (pListener->direction).x = (float)(int)mVar11._0_8_;
      (pListener->direction).y = (float)(int)((ulong)mVar11._0_8_ >> 0x20);
      mVar11 = ma_vec3f_init_3f(0.0,0.0,0.0);
      (pListener->velocity).x = (float)(int)mVar11._0_8_;
      (pListener->velocity).y = (float)(int)((ulong)mVar11._0_8_ >> 0x20);
      (pListener->velocity).z = mVar11.z;
      pListener->isEnabled = 1;
      if ((pListener->config).handedness == ma_handedness_left) {
        mVar11 = ma_vec3f_neg(pListener->direction);
        (pListener->direction).x = (float)(int)mVar11._0_8_;
        (pListener->direction).y = (float)(int)((ulong)mVar11._0_8_ >> 0x20);
        (pListener->direction).z = mVar11.z;
      }
      (pListener->config).pChannelMapOut = (ma_channel *)((long)pHeap + heapLayout.sizeInBytes);
      if (pConfig->pChannelMapOut == (ma_channel *)0x0) {
        ma_get_default_channel_map_for_spatializer
                  ((pListener->config).pChannelMapOut,(ulong)pConfig->channelsOut,
                   pConfig->channelsOut);
      }
      else {
        ma_channel_map_copy_or_default
                  ((pListener->config).pChannelMapOut,(ulong)pConfig->channelsOut,
                   pConfig->pChannelMapOut,pConfig->channelsOut);
      }
      pConfig_local._4_4_ = MA_SUCCESS;
    }
  }
  return pConfig_local._4_4_;
}

Assistant:

MA_API ma_result ma_spatializer_listener_init_preallocated(const ma_spatializer_listener_config* pConfig, void* pHeap, ma_spatializer_listener* pListener)
{
    ma_result result;
    ma_spatializer_listener_heap_layout heapLayout;

    if (pListener == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ZERO_OBJECT(pListener);

    result = ma_spatializer_listener_get_heap_layout(pConfig, &heapLayout);
    if (result != MA_SUCCESS) {
        return result;
    }

    pListener->_pHeap = pHeap;
    MA_ZERO_MEMORY(pHeap, heapLayout.sizeInBytes);

    pListener->config    = *pConfig;
    pListener->position  = ma_vec3f_init_3f(0, 0,  0);
    pListener->direction = ma_vec3f_init_3f(0, 0, -1);
    pListener->velocity  = ma_vec3f_init_3f(0, 0,  0);
    pListener->isEnabled = MA_TRUE;

    /* Swap the forward direction if we're left handed (it was initialized based on right handed). */
    if (pListener->config.handedness == ma_handedness_left) {
        pListener->direction = ma_vec3f_neg(pListener->direction);
    }


    /* We must always have a valid channel map. */
    pListener->config.pChannelMapOut = (ma_channel*)ma_offset_ptr(pHeap, heapLayout.channelMapOutOffset);

    /* Use a slightly different default channel map for stereo. */
    if (pConfig->pChannelMapOut == NULL) {
        ma_get_default_channel_map_for_spatializer(pListener->config.pChannelMapOut, pConfig->channelsOut, pConfig->channelsOut);
    } else {
        ma_channel_map_copy_or_default(pListener->config.pChannelMapOut, pConfig->channelsOut, pConfig->pChannelMapOut, pConfig->channelsOut);
    }

    return MA_SUCCESS;
}